

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall
Centaurus::NFABaseState<wchar_t,_Centaurus::IndexVector>::add_transition
          (NFABaseState<wchar_t,_Centaurus::IndexVector> *this,CharClass<wchar_t> *cc,int dest,
          bool long_flag)

{
  pointer pNVar1;
  bool bVar2;
  bool local_25;
  int local_24;
  
  if ((cc->m_ranges).
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (cc->m_ranges).
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    for (pNVar1 = (this->m_transitions).
                  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = pNVar1 != (this->m_transitions).
                          super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish, bVar2; pNVar1 = pNVar1 + 1) {
      if ((pNVar1->m_dest == dest) &&
         ((pNVar1->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pNVar1->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        CharClass<wchar_t>::operator|=(&pNVar1->m_label,cc);
        if (long_flag) {
          pNVar1->m_long = true;
        }
        if (bVar2) {
          return;
        }
        break;
      }
    }
  }
  std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>::
  emplace_back<Centaurus::CharClass<wchar_t>const&,int&,bool&>
            ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
              *)&this->m_transitions,cc,&local_24,&local_25);
  return;
}

Assistant:

void add_transition(const CharClass<TCHAR>& cc, int dest, bool long_flag = false)
    {
        if (!cc.is_epsilon())
        {
            for (auto& tr : m_transitions)
            {
                if (tr.dest() == dest && !tr.label().is_epsilon())
                {
                    tr.add_class(cc);
                    if (long_flag) tr.set_long();
                    return;
                }
            }
        }
        m_transitions.emplace_back(cc, dest, long_flag);
    }